

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O2

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::trivialHeuristic(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *lp)

{
  shared_ptr<soplex::Tolerances> *psVar1;
  undefined8 *puVar2;
  uint *puVar3;
  int iVar4;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar5;
  pointer pnVar6;
  pointer pnVar7;
  Real RVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  bool bVar17;
  bool bVar18;
  type_conflict5 tVar19;
  double *pdVar20;
  cpp_dec_float<100U,_int,_void> *pcVar21;
  ulong uVar22;
  Item *pIVar23;
  long lVar24;
  long lVar25;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  downLocks;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  upLocks;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  locksol;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  uppersol;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  lowersol;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lockObj;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  upperObj;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lowerObj;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  zerosol;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  zeroObj;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  undefined1 local_a68 [12];
  uint uStack_a5c;
  uint local_a58;
  uint uStack_a54;
  uint uStack_a50;
  uint uStack_a4c;
  uint local_a48;
  uint uStack_a44;
  uint uStack_a40;
  uint uStack_a3c;
  uint local_a38;
  uint uStack_a34;
  uint uStack_a30;
  uint uStack_a2c;
  int local_a28;
  bool local_a24;
  fpclass_type local_a20;
  int32_t iStack_a1c;
  cpp_dec_float<100U,_int,_void> local_a18;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_9c0;
  undefined1 local_9b8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_9b0;
  uint local_9a8 [11];
  undefined3 uStack_97b;
  int iStack_978;
  bool bStack_974;
  undefined8 local_970;
  _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_960;
  _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_948;
  _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_930;
  cpp_dec_float<100U,_int,_void> local_918;
  ulong local_8c8;
  double local_8c0;
  _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_8b8;
  _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_8a0;
  cpp_dec_float<100U,_int,_void> local_888;
  cpp_dec_float<100U,_int,_void> local_838;
  cpp_dec_float<100U,_int,_void> local_7e8;
  cpp_dec_float<100U,_int,_void> local_798;
  _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_740;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_728;
  _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_6d8;
  _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_6c0;
  _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_6a8;
  _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_690;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_678;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_628;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_5d8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_588;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_538;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4e8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_498;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_448;
  cpp_dec_float<100U,_int,_void> local_3f8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3a0;
  cpp_dec_float<100U,_int,_void> local_350;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_300;
  cpp_dec_float<100U,_int,_void> local_2b0;
  cpp_dec_float<100U,_int,_void> local_260;
  cpp_dec_float<100U,_int,_void> local_210;
  cpp_dec_float<100U,_int,_void> local_1c0;
  cpp_dec_float<100U,_int,_void> local_170;
  cpp_dec_float<100U,_int,_void> local_120;
  cpp_dec_float<100U,_int,_void> local_d0;
  cpp_dec_float<100U,_int,_void> local_80;
  
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)&local_740,
               (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)&local_8a0,
               (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)&local_8b8,
               (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)&local_930,
               (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)&local_948,
               (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)&local_960,
               (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  local_728.m_backend.data._M_elems._0_8_ =
       *(undefined8 *)
        (this->
        super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).m_objoffset.m_backend.data._M_elems;
  local_728.m_backend.data._M_elems._8_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 2);
  local_728.m_backend.data._M_elems._16_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 4);
  local_728.m_backend.data._M_elems._24_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 6);
  local_728.m_backend.data._M_elems._32_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 8);
  local_728.m_backend.data._M_elems._40_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 10);
  local_728.m_backend.data._M_elems._48_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 0xc);
  local_728.m_backend.data._M_elems._56_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 0xe);
  local_838.exp =
       (this->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).m_objoffset.m_backend.exp;
  local_838.neg =
       (this->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).m_objoffset.m_backend.neg;
  local_838.fpclass =
       (this->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).m_objoffset.m_backend.fpclass;
  local_838.prec_elem =
       (this->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).m_objoffset.m_backend.prec_elem;
  local_798.data._M_elems._0_8_ =
       *(undefined8 *)
        (this->
        super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).m_objoffset.m_backend.data._M_elems;
  local_798.data._M_elems._8_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 2);
  local_798.data._M_elems._16_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 4);
  local_798.data._M_elems._24_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 6);
  local_798.data._M_elems._32_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 8);
  local_798.data._M_elems._40_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 10);
  local_798.data._M_elems._48_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 0xc);
  local_798.data._M_elems._56_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 0xe);
  local_7e8.data._M_elems._0_8_ =
       *(undefined8 *)
        (this->
        super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).m_objoffset.m_backend.data._M_elems;
  local_7e8.data._M_elems._8_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 2);
  local_7e8.data._M_elems._16_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 4);
  local_7e8.data._M_elems._24_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 6);
  local_7e8.data._M_elems._32_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 8);
  local_7e8.data._M_elems._40_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 10);
  local_7e8.data._M_elems._48_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 0xc);
  local_7e8.data._M_elems._56_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 0xe);
  local_838.data._M_elems[0] =
       (this->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).m_objoffset.m_backend.data._M_elems[0];
  local_838.data._M_elems[1] =
       (this->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).m_objoffset.m_backend.data._M_elems[1];
  local_838.data._M_elems[2] =
       (this->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).m_objoffset.m_backend.data._M_elems[2];
  local_838.data._M_elems[3] =
       (this->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).m_objoffset.m_backend.data._M_elems[3];
  local_838.data._M_elems[4] =
       (this->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).m_objoffset.m_backend.data._M_elems[4];
  local_838.data._M_elems[5] =
       (this->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).m_objoffset.m_backend.data._M_elems[5];
  local_838.data._M_elems[6] =
       (this->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).m_objoffset.m_backend.data._M_elems[6];
  local_838.data._M_elems[7] =
       (this->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).m_objoffset.m_backend.data._M_elems[7];
  local_838.data._M_elems[8] =
       (this->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).m_objoffset.m_backend.data._M_elems[8];
  local_838.data._M_elems[9] =
       (this->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).m_objoffset.m_backend.data._M_elems[9];
  local_838.data._M_elems[10] =
       (this->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).m_objoffset.m_backend.data._M_elems[10];
  local_838.data._M_elems[0xb] =
       (this->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).m_objoffset.m_backend.data._M_elems[0xb];
  local_838.data._M_elems[0xc] =
       (this->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).m_objoffset.m_backend.data._M_elems[0xc];
  local_838.data._M_elems[0xd] =
       (this->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).m_objoffset.m_backend.data._M_elems[0xd];
  local_838.data._M_elems[0xe] =
       (this->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).m_objoffset.m_backend.data._M_elems[0xe];
  local_838.data._M_elems[0xf] =
       (this->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).m_objoffset.m_backend.data._M_elems[0xf];
  local_7e8.exp = local_838.exp;
  local_7e8.neg = local_838.neg;
  local_7e8.fpclass = local_838.fpclass;
  local_7e8.prec_elem = local_838.prec_elem;
  local_798.exp = local_838.exp;
  local_798.neg = local_838.neg;
  local_798.fpclass = local_838.fpclass;
  local_798.prec_elem = local_838.prec_elem;
  local_728.m_backend.exp = local_838.exp;
  local_728.m_backend.neg = local_838.neg;
  local_728.m_backend.fpclass = local_838.fpclass;
  local_728.m_backend.prec_elem = local_838.prec_elem;
  pdVar20 = (double *)infinity();
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            (&local_918,*pdVar20,(type *)0x0);
  local_9b8 = (undefined1  [8])&DAT_3ff0000000000000;
  feastol((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&local_a18,this);
  local_3f8.fpclass = cpp_dec_float_finite;
  local_3f8.prec_elem = 0x10;
  local_3f8.data._M_elems[0] = 0;
  local_3f8.data._M_elems[1] = 0;
  local_3f8.data._M_elems[2] = 0;
  local_3f8.data._M_elems[3] = 0;
  local_3f8.data._M_elems[4] = 0;
  local_3f8.data._M_elems[5] = 0;
  local_3f8.data._M_elems[6] = 0;
  local_3f8.data._M_elems[7] = 0;
  local_3f8.data._M_elems[8] = 0;
  local_3f8.data._M_elems[9] = 0;
  local_3f8.data._M_elems[10] = 0;
  local_3f8.data._M_elems[0xb] = 0;
  local_3f8.data._M_elems[0xc] = 0;
  local_3f8.data._M_elems[0xd] = 0;
  local_3f8.data._M_elems._56_5_ = 0;
  local_3f8.data._M_elems[0xf]._1_3_ = 0;
  local_3f8.exp = 0;
  local_3f8.neg = false;
  boost::multiprecision::default_ops::
  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,double>
            (&local_3f8,(double *)local_9b8,&local_a18);
  pdVar20 = (double *)infinity();
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            (&local_120,*pdVar20,(type *)0x0);
  psVar1 = &(this->
            super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances;
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_a68,
             &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  RVar8 = Tolerances::epsilon((Tolerances *)CONCAT44(local_a68._4_4_,local_a68._0_4_));
  bVar17 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                     ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)&local_3f8,
                      (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)&local_120,RVar8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a68 + 8));
  if (bVar17) {
    local_9b8 = (undefined1  [8])&DAT_3ff0000000000000;
    feastol((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *)local_a68,this);
    local_a18.fpclass = cpp_dec_float_finite;
    local_a18.prec_elem = 0x10;
    local_a18.data._M_elems[0] = 0;
    local_a18.data._M_elems[1] = 0;
    local_a18.data._M_elems[2] = 0;
    local_a18.data._M_elems[3] = 0;
    local_a18.data._M_elems[4] = 0;
    local_a18.data._M_elems[5] = 0;
    local_a18.data._M_elems[6] = 0;
    local_a18.data._M_elems[7] = 0;
    local_a18.data._M_elems[8] = 0;
    local_a18.data._M_elems[9] = 0;
    local_a18.data._M_elems[10] = 0;
    local_a18.data._M_elems[0xb] = 0;
    local_a18.data._M_elems[0xc] = 0;
    local_a18.data._M_elems[0xd] = 0;
    local_a18.data._M_elems[0xe] = 0;
    local_a18.data._M_elems[0xf] = 0;
    local_a18.exp = 0;
    local_a18.neg = false;
    boost::multiprecision::default_ops::
    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,double>
              (&local_a18,(double *)local_9b8,(cpp_dec_float<100U,_int,_void> *)local_a68);
    local_918.data._M_elems[0xf] = local_a18.data._M_elems[0xf];
    local_918.data._M_elems[0xe] = local_a18.data._M_elems[0xe];
    local_918.data._M_elems[0xc] = local_a18.data._M_elems[0xc];
    local_918.data._M_elems[0xd] = local_a18.data._M_elems[0xd];
    local_918.data._M_elems[8] = local_a18.data._M_elems[8];
    local_918.data._M_elems[9] = local_a18.data._M_elems[9];
    local_918.data._M_elems[10] = local_a18.data._M_elems[10];
    local_918.data._M_elems[0xb] = local_a18.data._M_elems[0xb];
    local_918.data._M_elems[4] = local_a18.data._M_elems[4];
    local_918.data._M_elems[5] = local_a18.data._M_elems[5];
    local_918.data._M_elems[6] = local_a18.data._M_elems[6];
    local_918.data._M_elems[7] = local_a18.data._M_elems[7];
    local_918.data._M_elems[0] = local_a18.data._M_elems[0];
    local_918.data._M_elems[1] = local_a18.data._M_elems[1];
    local_918.data._M_elems[2] = local_a18.data._M_elems[2];
    local_918.data._M_elems[3] = local_a18.data._M_elems[3];
    local_918.exp = local_a18.exp;
    local_918.neg = local_a18.neg;
    local_918.fpclass = local_a18.fpclass;
    local_918.prec_elem = local_a18.prec_elem;
  }
  bVar17 = true;
  uVar22 = (ulong)(uint)(lp->
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .set.thenum;
  local_9c0 = lp;
  do {
    if ((int)uVar22 < 1) {
      std::
      vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::vector((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                *)&local_690,
               (vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                *)&local_8a0);
      bVar18 = checkSolution(this,lp,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)&local_690);
      std::
      _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::~_Vector_base(&local_690);
      if (bVar18) {
        tVar19 = boost::multiprecision::operator>
                           ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_798,&this->m_cutoffbound);
        if (tVar19) {
          *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 0xc) =
               local_798.data._M_elems._48_8_;
          *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 0xe) =
               local_798.data._M_elems._56_8_;
          *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 8) =
               local_798.data._M_elems._32_8_;
          *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 10) =
               local_798.data._M_elems._40_8_;
          *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 4) =
               local_798.data._M_elems._16_8_;
          *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 6) =
               local_798.data._M_elems._24_8_;
          *(undefined8 *)(this->m_cutoffbound).m_backend.data._M_elems =
               local_798.data._M_elems._0_8_;
          *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 2) =
               local_798.data._M_elems._8_8_;
          (this->m_cutoffbound).m_backend.exp = local_798.exp;
          (this->m_cutoffbound).m_backend.neg = local_798.neg;
          (this->m_cutoffbound).m_backend.fpclass = local_798.fpclass;
          (this->m_cutoffbound).m_backend.prec_elem = local_798.prec_elem;
        }
      }
      std::
      vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::vector((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                *)&local_6a8,
               (vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                *)&local_8b8);
      bVar18 = checkSolution(this,lp,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)&local_6a8);
      std::
      _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::~_Vector_base(&local_6a8);
      if (bVar18) {
        tVar19 = boost::multiprecision::operator>
                           ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_7e8,&this->m_cutoffbound);
        if (tVar19) {
          *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 0xc) =
               local_7e8.data._M_elems._48_8_;
          *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 0xe) =
               local_7e8.data._M_elems._56_8_;
          *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 8) =
               local_7e8.data._M_elems._32_8_;
          *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 10) =
               local_7e8.data._M_elems._40_8_;
          *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 4) =
               local_7e8.data._M_elems._16_8_;
          *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 6) =
               local_7e8.data._M_elems._24_8_;
          *(undefined8 *)(this->m_cutoffbound).m_backend.data._M_elems =
               local_7e8.data._M_elems._0_8_;
          *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 2) =
               local_7e8.data._M_elems._8_8_;
          (this->m_cutoffbound).m_backend.exp = local_7e8.exp;
          (this->m_cutoffbound).m_backend.neg = local_7e8.neg;
          (this->m_cutoffbound).m_backend.fpclass = local_7e8.fpclass;
          (this->m_cutoffbound).m_backend.prec_elem = local_7e8.prec_elem;
        }
      }
      if (bVar17) {
        std::
        vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ::vector((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  *)&local_6c0,
                 (vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  *)&local_740);
        bVar17 = checkSolution(this,lp,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        *)&local_6c0);
        std::
        _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ::~_Vector_base(&local_6c0);
        if (bVar17) {
          tVar19 = boost::multiprecision::operator>(&local_728,&this->m_cutoffbound);
          if (tVar19) {
            *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 0xc) =
                 local_728.m_backend.data._M_elems._48_8_;
            *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 0xe) =
                 local_728.m_backend.data._M_elems._56_8_;
            *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 8) =
                 local_728.m_backend.data._M_elems._32_8_;
            *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 10) =
                 local_728.m_backend.data._M_elems._40_8_;
            *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 4) =
                 local_728.m_backend.data._M_elems._16_8_;
            *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 6) =
                 local_728.m_backend.data._M_elems._24_8_;
            *(undefined8 *)(this->m_cutoffbound).m_backend.data._M_elems =
                 local_728.m_backend.data._M_elems._0_8_;
            *(undefined8 *)((this->m_cutoffbound).m_backend.data._M_elems + 2) =
                 local_728.m_backend.data._M_elems._8_8_;
            (this->m_cutoffbound).m_backend.exp = local_728.m_backend.exp;
            (this->m_cutoffbound).m_backend.neg = local_728.m_backend.neg;
            (this->m_cutoffbound).m_backend.fpclass = local_728.m_backend.fpclass;
            (this->m_cutoffbound).m_backend.prec_elem = local_728.m_backend.prec_elem;
          }
        }
      }
      std::
      vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::vector((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                *)&local_6d8,
               (vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                *)&local_930);
      bVar17 = checkSolution(this,lp,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)&local_6d8);
      std::
      _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::~_Vector_base(&local_6d8);
      if (bVar17) {
        tVar19 = boost::multiprecision::operator>
                           ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_838,&this->m_cutoffbound);
        if (tVar19) {
          *(ulong *)((this->m_cutoffbound).m_backend.data._M_elems + 0xc) =
               CONCAT44(local_838.data._M_elems[0xd],local_838.data._M_elems[0xc]);
          *(ulong *)((this->m_cutoffbound).m_backend.data._M_elems + 0xe) =
               CONCAT44(local_838.data._M_elems[0xf],local_838.data._M_elems[0xe]);
          *(ulong *)((this->m_cutoffbound).m_backend.data._M_elems + 8) =
               CONCAT44(local_838.data._M_elems[9],local_838.data._M_elems[8]);
          *(ulong *)((this->m_cutoffbound).m_backend.data._M_elems + 10) =
               CONCAT44(local_838.data._M_elems[0xb],local_838.data._M_elems[10]);
          *(ulong *)((this->m_cutoffbound).m_backend.data._M_elems + 4) =
               CONCAT44(local_838.data._M_elems[5],local_838.data._M_elems[4]);
          *(ulong *)((this->m_cutoffbound).m_backend.data._M_elems + 6) =
               CONCAT44(local_838.data._M_elems[7],local_838.data._M_elems[6]);
          *(ulong *)(this->m_cutoffbound).m_backend.data._M_elems =
               CONCAT44(local_838.data._M_elems[1],local_838.data._M_elems[0]);
          *(ulong *)((this->m_cutoffbound).m_backend.data._M_elems + 2) =
               CONCAT44(local_838.data._M_elems[3],local_838.data._M_elems[2]);
          (this->m_cutoffbound).m_backend.exp = local_838.exp;
          (this->m_cutoffbound).m_backend.neg = local_838.neg;
          (this->m_cutoffbound).m_backend.fpclass = local_838.fpclass;
          (this->m_cutoffbound).m_backend.prec_elem = local_838.prec_elem;
        }
      }
      std::
      _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::~_Vector_base(&local_960);
      std::
      _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::~_Vector_base(&local_948);
      std::
      _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::~_Vector_base(&local_930);
      std::
      _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::~_Vector_base(&local_8b8);
      std::
      _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::~_Vector_base(&local_8a0);
      std::
      _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::~_Vector_base(&local_740);
      return;
    }
    uVar22 = uVar22 - 1;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
              (&local_948._M_impl.super__Vector_impl_data._M_start[uVar22].m_backend,0);
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
              (&local_960._M_impl.super__Vector_impl_data._M_start[uVar22].m_backend,0);
    pIVar23 = (lp->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.theitem +
              (lp->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thekey[uVar22].idx;
    lVar24 = 0;
    local_8c8 = uVar22;
    for (lVar25 = 0; lp = local_9c0,
        lVar25 < (pIVar23->data).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .memused; lVar25 = lVar25 + 1) {
      pNVar5 = (pIVar23->data).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      puVar2 = (undefined8 *)((long)&(pNVar5->val).m_backend.data + lVar24);
      uVar9 = *puVar2;
      uVar10 = puVar2[1];
      puVar2 = (undefined8 *)((long)&(pNVar5->val).m_backend.data + lVar24 + 0x10);
      uVar11 = *puVar2;
      uVar12 = puVar2[1];
      puVar2 = (undefined8 *)((long)&(pNVar5->val).m_backend.data + lVar24 + 0x20);
      uVar13 = *puVar2;
      uVar14 = puVar2[1];
      puVar2 = (undefined8 *)((long)&(pNVar5->val).m_backend.data + lVar24 + 0x30);
      uVar15 = *puVar2;
      uVar16 = puVar2[1];
      local_a18.data._M_elems[0xc] = (uint)uVar15;
      local_a18.data._M_elems[0xd] = (uint)((ulong)uVar15 >> 0x20);
      local_a18.data._M_elems[0xe] = (uint)uVar16;
      local_a18.data._M_elems[0xf] = (uint)((ulong)uVar16 >> 0x20);
      local_a18.data._M_elems[8] = (uint)uVar13;
      local_a18.data._M_elems[9] = (uint)((ulong)uVar13 >> 0x20);
      local_a18.data._M_elems[10] = (uint)uVar14;
      local_a18.data._M_elems[0xb] = (uint)((ulong)uVar14 >> 0x20);
      local_a18.data._M_elems[4] = (uint)uVar11;
      local_a18.data._M_elems[5] = (uint)((ulong)uVar11 >> 0x20);
      local_a18.data._M_elems[6] = (uint)uVar12;
      local_a18.data._M_elems[7] = (uint)((ulong)uVar12 >> 0x20);
      local_a18.data._M_elems[0] = (uint)uVar9;
      local_a18.data._M_elems[1] = (uint)((ulong)uVar9 >> 0x20);
      local_a18.data._M_elems[2] = (uint)uVar10;
      local_a18.data._M_elems[3] = (uint)((ulong)uVar10 >> 0x20);
      local_a18.exp = *(int *)((long)&(pNVar5->val).m_backend.data + lVar24 + 0x40);
      local_a18.neg = *(bool *)((long)&(pNVar5->val).m_backend.data + lVar24 + 0x44);
      local_a18._72_8_ = *(undefined8 *)((long)&(pNVar5->val).m_backend.data + lVar24 + 0x48);
      iVar4 = *(int *)((long)(&((pIVar23->data).
                                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .m_elem)->val + 1) + lVar24);
      pnVar6 = (local_9c0->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).left.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar7 = pnVar6 + iVar4;
      local_448.m_backend.data._M_elems[0] = (pnVar7->m_backend).data._M_elems[0];
      local_448.m_backend.data._M_elems[1] = *(uint *)((long)&(pnVar7->m_backend).data + 4);
      local_448.m_backend.data._M_elems[2] = *(uint *)((long)&(pnVar7->m_backend).data + 8);
      local_448.m_backend.data._M_elems[3] = *(uint *)((long)&(pnVar7->m_backend).data + 0xc);
      puVar3 = (uint *)((long)&pnVar6[iVar4].m_backend.data + 0x10);
      local_448.m_backend.data._M_elems[4] = *puVar3;
      local_448.m_backend.data._M_elems[5] = puVar3[1];
      local_448.m_backend.data._M_elems[6] = puVar3[2];
      local_448.m_backend.data._M_elems[7] = puVar3[3];
      puVar3 = (uint *)((long)&pnVar6[iVar4].m_backend.data + 0x20);
      local_448.m_backend.data._M_elems[8] = *puVar3;
      local_448.m_backend.data._M_elems[9] = puVar3[1];
      local_448.m_backend.data._M_elems[10] = puVar3[2];
      local_448.m_backend.data._M_elems[0xb] = puVar3[3];
      puVar3 = (uint *)((long)&pnVar6[iVar4].m_backend.data + 0x30);
      local_448.m_backend.data._M_elems[0xc] = *puVar3;
      local_448.m_backend.data._M_elems[0xd] = puVar3[1];
      local_448.m_backend.data._M_elems[0xe] = puVar3[2];
      local_448.m_backend.data._M_elems[0xf] = puVar3[3];
      local_448.m_backend.exp = pnVar6[iVar4].m_backend.exp;
      local_448.m_backend.neg = pnVar6[iVar4].m_backend.neg;
      local_448.m_backend.fpclass = pnVar6[iVar4].m_backend.fpclass;
      local_448.m_backend.prec_elem = pnVar6[iVar4].m_backend.prec_elem;
      pdVar20 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                (&local_170,-*pdVar20,(type *)0x0);
      std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_a68,
                 &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
      RVar8 = Tolerances::epsilon((Tolerances *)CONCAT44(local_a68._4_4_,local_a68._0_4_));
      bVar18 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                         (&local_448,
                          (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&local_170,RVar8);
      if (bVar18) {
        iVar4 = *(int *)((long)(&((pIVar23->data).
                                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 .m_elem)->val + 1) + lVar24);
        pnVar6 = (local_9c0->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).right.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pnVar7 = pnVar6 + iVar4;
        local_498.m_backend.data._M_elems[0] = (pnVar7->m_backend).data._M_elems[0];
        local_498.m_backend.data._M_elems[1] = *(uint *)((long)&(pnVar7->m_backend).data + 4);
        local_498.m_backend.data._M_elems[2] = *(uint *)((long)&(pnVar7->m_backend).data + 8);
        local_498.m_backend.data._M_elems[3] = *(uint *)((long)&(pnVar7->m_backend).data + 0xc);
        puVar3 = (uint *)((long)&pnVar6[iVar4].m_backend.data + 0x10);
        local_498.m_backend.data._M_elems[4] = *puVar3;
        local_498.m_backend.data._M_elems[5] = puVar3[1];
        local_498.m_backend.data._M_elems[6] = puVar3[2];
        local_498.m_backend.data._M_elems[7] = puVar3[3];
        puVar3 = (uint *)((long)&pnVar6[iVar4].m_backend.data + 0x20);
        local_498.m_backend.data._M_elems[8] = *puVar3;
        local_498.m_backend.data._M_elems[9] = puVar3[1];
        local_498.m_backend.data._M_elems[10] = puVar3[2];
        local_498.m_backend.data._M_elems[0xb] = puVar3[3];
        puVar3 = (uint *)((long)&pnVar6[iVar4].m_backend.data + 0x30);
        local_498.m_backend.data._M_elems[0xc] = *puVar3;
        local_498.m_backend.data._M_elems[0xd] = puVar3[1];
        local_498.m_backend.data._M_elems[0xe] = puVar3[2];
        local_498.m_backend.data._M_elems[0xf] = puVar3[3];
        local_498.m_backend.exp = pnVar6[iVar4].m_backend.exp;
        local_498.m_backend.neg = pnVar6[iVar4].m_backend.neg;
        local_498.m_backend.fpclass = pnVar6[iVar4].m_backend.fpclass;
        local_498.m_backend.prec_elem = pnVar6[iVar4].m_backend.prec_elem;
        pdVar20 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                  (&local_1c0,*pdVar20,(type *)0x0);
        std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_9b8,
                   &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
        RVar8 = Tolerances::epsilon((Tolerances *)local_9b8);
        bVar18 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                           (&local_498,
                            (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_1c0,RVar8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_9b0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a68 + 8));
        if (!bVar18) goto LAB_00337a70;
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
        ::operator++((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)local_a68,local_948._M_impl.super__Vector_impl_data._M_start + uVar22,0);
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
        ::operator++((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)local_a68,local_960._M_impl.super__Vector_impl_data._M_start + uVar22,0);
      }
      else {
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a68 + 8));
LAB_00337a70:
        iVar4 = *(int *)((long)(&((pIVar23->data).
                                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 .m_elem)->val + 1) + lVar24);
        pnVar6 = (local_9c0->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).left.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pnVar7 = pnVar6 + iVar4;
        local_4e8.m_backend.data._M_elems[0] = (pnVar7->m_backend).data._M_elems[0];
        local_4e8.m_backend.data._M_elems[1] = *(uint *)((long)&(pnVar7->m_backend).data + 4);
        local_4e8.m_backend.data._M_elems[2] = *(uint *)((long)&(pnVar7->m_backend).data + 8);
        local_4e8.m_backend.data._M_elems[3] = *(uint *)((long)&(pnVar7->m_backend).data + 0xc);
        puVar3 = (uint *)((long)&pnVar6[iVar4].m_backend.data + 0x10);
        local_4e8.m_backend.data._M_elems[4] = *puVar3;
        local_4e8.m_backend.data._M_elems[5] = puVar3[1];
        local_4e8.m_backend.data._M_elems[6] = puVar3[2];
        local_4e8.m_backend.data._M_elems[7] = puVar3[3];
        puVar3 = (uint *)((long)&pnVar6[iVar4].m_backend.data + 0x20);
        local_4e8.m_backend.data._M_elems[8] = *puVar3;
        local_4e8.m_backend.data._M_elems[9] = puVar3[1];
        local_4e8.m_backend.data._M_elems[10] = puVar3[2];
        local_4e8.m_backend.data._M_elems[0xb] = puVar3[3];
        puVar3 = (uint *)((long)&pnVar6[iVar4].m_backend.data + 0x30);
        local_4e8.m_backend.data._M_elems[0xc] = *puVar3;
        local_4e8.m_backend.data._M_elems[0xd] = puVar3[1];
        local_4e8.m_backend.data._M_elems[0xe] = puVar3[2];
        local_4e8.m_backend.data._M_elems[0xf] = puVar3[3];
        local_4e8.m_backend.exp = pnVar6[iVar4].m_backend.exp;
        local_4e8.m_backend.neg = pnVar6[iVar4].m_backend.neg;
        local_4e8.m_backend.fpclass = pnVar6[iVar4].m_backend.fpclass;
        local_4e8.m_backend.prec_elem = pnVar6[iVar4].m_backend.prec_elem;
        pdVar20 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                  (&local_210,-*pdVar20,(type *)0x0);
        std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_a68,
                   &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
        RVar8 = Tolerances::epsilon((Tolerances *)CONCAT44(local_a68._4_4_,local_a68._0_4_));
        bVar18 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                           (&local_4e8,
                            (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_210,RVar8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a68 + 8));
        if (bVar18) {
          local_a68._0_4_ = 0;
          tVar19 = boost::multiprecision::operator>
                             ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_a18,(int *)local_a68);
          if (tVar19) {
            boost::multiprecision::
            number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            ::operator++((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)local_a68,local_960._M_impl.super__Vector_impl_data._M_start + uVar22,0)
            ;
          }
          else {
            local_a68._0_4_ = 0;
            tVar19 = boost::multiprecision::operator<
                               ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)&local_a18,(int *)local_a68);
            if (tVar19) {
              boost::multiprecision::
              number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              ::operator++((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)local_a68,local_948._M_impl.super__Vector_impl_data._M_start + uVar22,
                           0);
            }
          }
        }
        else {
          iVar4 = *(int *)((long)(&((pIVar23->data).
                                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   .m_elem)->val + 1) + lVar24);
          pnVar6 = (local_9c0->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).right.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pnVar7 = pnVar6 + iVar4;
          local_538.m_backend.data._M_elems[0] = (pnVar7->m_backend).data._M_elems[0];
          local_538.m_backend.data._M_elems[1] = *(uint *)((long)&(pnVar7->m_backend).data + 4);
          local_538.m_backend.data._M_elems[2] = *(uint *)((long)&(pnVar7->m_backend).data + 8);
          local_538.m_backend.data._M_elems[3] = *(uint *)((long)&(pnVar7->m_backend).data + 0xc);
          puVar3 = (uint *)((long)&pnVar6[iVar4].m_backend.data + 0x10);
          local_538.m_backend.data._M_elems[4] = *puVar3;
          local_538.m_backend.data._M_elems[5] = puVar3[1];
          local_538.m_backend.data._M_elems[6] = puVar3[2];
          local_538.m_backend.data._M_elems[7] = puVar3[3];
          puVar3 = (uint *)((long)&pnVar6[iVar4].m_backend.data + 0x20);
          local_538.m_backend.data._M_elems[8] = *puVar3;
          local_538.m_backend.data._M_elems[9] = puVar3[1];
          local_538.m_backend.data._M_elems[10] = puVar3[2];
          local_538.m_backend.data._M_elems[0xb] = puVar3[3];
          puVar3 = (uint *)((long)&pnVar6[iVar4].m_backend.data + 0x30);
          local_538.m_backend.data._M_elems[0xc] = *puVar3;
          local_538.m_backend.data._M_elems[0xd] = puVar3[1];
          local_538.m_backend.data._M_elems[0xe] = puVar3[2];
          local_538.m_backend.data._M_elems[0xf] = puVar3[3];
          local_538.m_backend.exp = pnVar6[iVar4].m_backend.exp;
          local_538.m_backend.neg = pnVar6[iVar4].m_backend.neg;
          local_538.m_backend.fpclass = pnVar6[iVar4].m_backend.fpclass;
          local_538.m_backend.prec_elem = pnVar6[iVar4].m_backend.prec_elem;
          pdVar20 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                    (&local_260,*pdVar20,(type *)0x0);
          std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_a68,
                     &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
          RVar8 = Tolerances::epsilon((Tolerances *)CONCAT44(local_a68._4_4_,local_a68._0_4_));
          bVar18 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                             (&local_538,
                              (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_260,RVar8);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a68 + 8));
          if (bVar18) {
            local_a68._0_4_ = 0;
            tVar19 = boost::multiprecision::operator>
                               ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)&local_a18,(int *)local_a68);
            if (tVar19) {
              boost::multiprecision::
              number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              ::operator++((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)local_a68,local_948._M_impl.super__Vector_impl_data._M_start + uVar22,
                           0);
            }
            else {
              local_a68._0_4_ = 0;
              tVar19 = boost::multiprecision::operator<
                                 ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&local_a18,(int *)local_a68);
              if (tVar19) {
                boost::multiprecision::
                number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                ::operator++((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)local_a68,
                             local_960._M_impl.super__Vector_impl_data._M_start + uVar22,0);
              }
            }
          }
        }
      }
      lVar24 = lVar24 + 0x54;
    }
    pnVar7 = (local_9c0->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).low.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar9 = *(undefined8 *)&pnVar7[uVar22].m_backend.data;
    uVar10 = *(undefined8 *)((long)&pnVar7[uVar22].m_backend.data + 8);
    puVar3 = (uint *)((long)&pnVar7[uVar22].m_backend.data + 0x10);
    uVar11 = *(undefined8 *)puVar3;
    uVar12 = *(undefined8 *)(puVar3 + 2);
    puVar3 = (uint *)((long)&pnVar7[uVar22].m_backend.data + 0x20);
    uVar13 = *(undefined8 *)puVar3;
    uVar14 = *(undefined8 *)(puVar3 + 2);
    puVar3 = (uint *)((long)&pnVar7[uVar22].m_backend.data + 0x30);
    uVar15 = *(undefined8 *)puVar3;
    uVar16 = *(undefined8 *)(puVar3 + 2);
    local_a18.data._M_elems[0xc] = (uint)uVar15;
    local_a18.data._M_elems[0xd] = (uint)((ulong)uVar15 >> 0x20);
    local_a18.data._M_elems[0xe] = (uint)uVar16;
    local_a18.data._M_elems[0xf] = (uint)((ulong)uVar16 >> 0x20);
    local_a18.data._M_elems[8] = (uint)uVar13;
    local_a18.data._M_elems[9] = (uint)((ulong)uVar13 >> 0x20);
    local_a18.data._M_elems[10] = (uint)uVar14;
    local_a18.data._M_elems[0xb] = (uint)((ulong)uVar14 >> 0x20);
    local_a18.data._M_elems[4] = (uint)uVar11;
    local_a18.data._M_elems[5] = (uint)((ulong)uVar11 >> 0x20);
    local_a18.data._M_elems[6] = (uint)uVar12;
    local_a18.data._M_elems[7] = (uint)((ulong)uVar12 >> 0x20);
    local_a18.data._M_elems[0] = (uint)uVar9;
    local_a18.data._M_elems[1] = (uint)((ulong)uVar9 >> 0x20);
    local_a18.data._M_elems[2] = (uint)uVar10;
    local_a18.data._M_elems[3] = (uint)((ulong)uVar10 >> 0x20);
    local_a18.exp = pnVar7[uVar22].m_backend.exp;
    local_a18.neg = pnVar7[uVar22].m_backend.neg;
    local_678.m_backend.fpclass = pnVar7[uVar22].m_backend.fpclass;
    local_678.m_backend.prec_elem = pnVar7[uVar22].m_backend.prec_elem;
    local_a18.prec_elem = local_678.m_backend.prec_elem;
    local_a18.fpclass = local_678.m_backend.fpclass;
    pnVar7 = (local_9c0->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).up.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar9 = *(undefined8 *)&pnVar7[uVar22].m_backend.data;
    uVar10 = *(undefined8 *)((long)&pnVar7[uVar22].m_backend.data + 8);
    puVar3 = (uint *)((long)&pnVar7[uVar22].m_backend.data + 0x10);
    uVar11 = *(undefined8 *)puVar3;
    uVar12 = *(undefined8 *)(puVar3 + 2);
    puVar3 = (uint *)((long)&pnVar7[uVar22].m_backend.data + 0x20);
    uVar13 = *(undefined8 *)puVar3;
    uVar14 = *(undefined8 *)(puVar3 + 2);
    puVar3 = (uint *)((long)&pnVar7[uVar22].m_backend.data + 0x30);
    uVar15 = *(undefined8 *)puVar3;
    _uStack_a30 = *(undefined8 *)(puVar3 + 2);
    local_a38 = (uint)uVar15;
    uStack_a34 = (uint)((ulong)uVar15 >> 0x20);
    local_a48 = (uint)uVar13;
    uStack_a44 = (uint)((ulong)uVar13 >> 0x20);
    uStack_a40 = (uint)uVar14;
    uStack_a3c = (uint)((ulong)uVar14 >> 0x20);
    local_a58 = (uint)uVar11;
    uStack_a54 = (uint)((ulong)uVar11 >> 0x20);
    uStack_a50 = (uint)uVar12;
    uStack_a4c = (uint)((ulong)uVar12 >> 0x20);
    local_a68._0_4_ = (undefined4)uVar9;
    local_a68._4_4_ = (undefined4)((ulong)uVar9 >> 0x20);
    local_a68._8_4_ = (undefined4)uVar10;
    uStack_a5c = (uint)((ulong)uVar10 >> 0x20);
    local_a28 = pnVar7[uVar22].m_backend.exp;
    local_a24 = pnVar7[uVar22].m_backend.neg;
    local_a20 = pnVar7[uVar22].m_backend.fpclass;
    iStack_a1c = pnVar7[uVar22].m_backend.prec_elem;
    local_678.m_backend.data._M_elems[0] = local_a18.data._M_elems[0];
    local_678.m_backend.data._M_elems[1] = local_a18.data._M_elems[1];
    local_678.m_backend.data._M_elems[2] = local_a18.data._M_elems[2];
    local_678.m_backend.data._M_elems[3] = local_a18.data._M_elems[3];
    local_678.m_backend.data._M_elems[4] = local_a18.data._M_elems[4];
    local_678.m_backend.data._M_elems[5] = local_a18.data._M_elems[5];
    local_678.m_backend.data._M_elems[6] = local_a18.data._M_elems[6];
    local_678.m_backend.data._M_elems[7] = local_a18.data._M_elems[7];
    local_678.m_backend.data._M_elems[8] = local_a18.data._M_elems[8];
    local_678.m_backend.data._M_elems[9] = local_a18.data._M_elems[9];
    local_678.m_backend.data._M_elems[10] = local_a18.data._M_elems[10];
    local_678.m_backend.data._M_elems[0xb] = local_a18.data._M_elems[0xb];
    local_678.m_backend.data._M_elems[0xc] = local_a18.data._M_elems[0xc];
    local_678.m_backend.data._M_elems[0xd] = local_a18.data._M_elems[0xd];
    local_678.m_backend.data._M_elems[0xe] = local_a18.data._M_elems[0xe];
    local_678.m_backend.data._M_elems[0xf] = local_a18.data._M_elems[0xf];
    local_678.m_backend.exp = local_a18.exp;
    local_678.m_backend.neg = local_a18.neg;
    pdVar20 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
              (&local_80,-*pdVar20,(type *)0x0);
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_9b8,
               &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
    RVar8 = Tolerances::epsilon((Tolerances *)local_9b8);
    bVar18 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                       (&local_678,
                        (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_80,RVar8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_9b0);
    if (bVar18) {
      local_9b8 = (undefined1  [8])CONCAT44(local_918.data._M_elems[1],local_918.data._M_elems[0]);
      _Stack_9b0._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           CONCAT44(local_918.data._M_elems[3],local_918.data._M_elems[2]);
      local_9a8[1] = local_918.data._M_elems[5];
      local_9a8[0] = local_918.data._M_elems[4];
      local_9a8[3] = local_918.data._M_elems[7];
      local_9a8[2] = local_918.data._M_elems[6];
      local_9a8[5] = local_918.data._M_elems[9];
      local_9a8[4] = local_918.data._M_elems[8];
      local_9a8[7] = local_918.data._M_elems[0xb];
      local_9a8[6] = local_918.data._M_elems[10];
      local_9a8[9] = local_918.data._M_elems[0xd];
      local_9a8[8] = local_918.data._M_elems[0xc];
      stack0xfffffffffffff680 = local_918.data._M_elems._56_5_;
      uStack_97b = local_918.data._M_elems[0xf]._1_3_;
      iStack_978 = local_918.exp;
      bStack_974 = local_918.neg;
      local_970._0_4_ = local_918.fpclass;
      local_970._4_4_ = local_918.prec_elem;
      if (local_918.fpclass != cpp_dec_float_finite || local_918.data._M_elems[0] != 0) {
        bStack_974 = (bool)(local_918.neg ^ 1);
      }
      tVar19 = boost::multiprecision::operator<
                         ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)local_9b8,
                          (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)local_a68);
      if (tVar19) {
        local_888.data._M_elems[1] = local_918.data._M_elems[2];
        local_888.data._M_elems[0] = local_918.data._M_elems[1];
        local_888.data._M_elems[3] = local_918.data._M_elems[4];
        local_888.data._M_elems[2] = local_918.data._M_elems[3];
        local_888.data._M_elems[5] = local_918.data._M_elems[6];
        local_888.data._M_elems[4] = local_918.data._M_elems[5];
        local_888.data._M_elems[7] = local_918.data._M_elems[8];
        local_888.data._M_elems[6] = local_918.data._M_elems[7];
        local_888.data._M_elems[9] = local_918.data._M_elems[10];
        local_888.data._M_elems[8] = local_918.data._M_elems[9];
        local_888.data._M_elems[10] = local_918.data._M_elems[0xb];
        local_888.data._M_elems[0xb] = local_918.data._M_elems[0xc];
        local_888.data._M_elems[0xc] = local_918.data._M_elems[0xd];
        local_888.data._M_elems[0xd] = local_918.data._M_elems[0xe];
        local_888.data._M_elems[0xe] = local_918.data._M_elems[0xf];
        local_a18.exp = local_918.exp;
        local_a18.prec_elem = local_918.prec_elem;
        if (local_918.fpclass == cpp_dec_float_finite && local_918.data._M_elems[0] == 0) {
          local_a18.neg = local_918.neg;
          local_a18.data._M_elems[0] = 0;
          local_a18.fpclass = cpp_dec_float_finite;
        }
        else {
          local_a18.neg = (bool)(local_918.neg ^ 1);
          local_a18.data._M_elems[0] = local_918.data._M_elems[0];
          local_a18.fpclass = local_918.fpclass;
        }
      }
      else {
        local_888.data._M_elems[1] = local_a68._8_4_;
        local_888.data._M_elems[0] = local_a68._4_4_;
        local_888.data._M_elems[3] = local_a58;
        local_888.data._M_elems[2] = uStack_a5c;
        local_888.data._M_elems[5] = uStack_a50;
        local_888.data._M_elems[4] = uStack_a54;
        local_888.data._M_elems[7] = local_a48;
        local_888.data._M_elems[6] = uStack_a4c;
        local_888.data._M_elems[9] = uStack_a40;
        local_888.data._M_elems[8] = uStack_a44;
        local_888.data._M_elems[10] = uStack_a3c;
        local_888.data._M_elems[0xb] = local_a38;
        local_888.data._M_elems[0xc] = uStack_a34;
        local_888.data._M_elems[0xd] = (uint)_uStack_a30;
        local_888.data._M_elems[0xe] = SUB84(_uStack_a30,4);
        local_a18.exp = local_a28;
        local_a18.neg = local_a24;
        local_a18.prec_elem = iStack_a1c;
        local_a18.data._M_elems[0] = local_a68._0_4_;
        local_a18.fpclass = local_a20;
      }
      local_a18.data._M_elems[0xd] = local_888.data._M_elems[0xc];
      local_a18.data._M_elems[0xe] = local_888.data._M_elems[0xd];
      local_a18.data._M_elems[0xf] = local_888.data._M_elems[0xe];
      local_a18.data._M_elems[9] = local_888.data._M_elems[8];
      local_a18.data._M_elems[10] = local_888.data._M_elems[9];
      local_a18.data._M_elems[0xb] = local_888.data._M_elems[10];
      local_a18.data._M_elems[0xc] = local_888.data._M_elems[0xb];
      local_a18.data._M_elems[5] = local_888.data._M_elems[4];
      local_a18.data._M_elems[6] = local_888.data._M_elems[5];
      local_a18.data._M_elems[7] = local_888.data._M_elems[6];
      local_a18.data._M_elems[8] = local_888.data._M_elems[7];
      local_a18.data._M_elems[1] = local_888.data._M_elems[0];
      local_a18.data._M_elems[2] = local_888.data._M_elems[1];
      local_a18.data._M_elems[3] = local_888.data._M_elems[2];
      local_a18.data._M_elems[4] = local_888.data._M_elems[3];
    }
    local_588.m_backend.data._M_elems[0xc] = local_a38;
    local_588.m_backend.data._M_elems[0xd] = uStack_a34;
    local_588.m_backend.data._M_elems[0xe] = uStack_a30;
    local_588.m_backend.data._M_elems[0xf] = uStack_a2c;
    local_588.m_backend.data._M_elems[8] = local_a48;
    local_588.m_backend.data._M_elems[9] = uStack_a44;
    local_588.m_backend.data._M_elems[10] = uStack_a40;
    local_588.m_backend.data._M_elems[0xb] = uStack_a3c;
    local_588.m_backend.data._M_elems[4] = local_a58;
    local_588.m_backend.data._M_elems[5] = uStack_a54;
    local_588.m_backend.data._M_elems[6] = uStack_a50;
    local_588.m_backend.data._M_elems[7] = uStack_a4c;
    local_588.m_backend.data._M_elems[0] = local_a68._0_4_;
    local_588.m_backend.data._M_elems[1] = local_a68._4_4_;
    local_588.m_backend.data._M_elems[2] = local_a68._8_4_;
    local_588.m_backend.data._M_elems[3] = uStack_a5c;
    local_588.m_backend.exp = local_a28;
    local_588.m_backend.neg = local_a24;
    local_588.m_backend.fpclass = local_a20;
    local_588.m_backend.prec_elem = iStack_a1c;
    pdVar20 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
              (&local_d0,*pdVar20,(type *)0x0);
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_9b8,
               &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
    RVar8 = Tolerances::epsilon((Tolerances *)local_9b8);
    bVar18 = GE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                       (&local_588,
                        (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_d0,RVar8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_9b0);
    if (bVar18) {
      tVar19 = boost::multiprecision::operator>
                         ((lp->
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).low.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar22,
                          (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&local_918);
      pcVar21 = &(lp->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).low.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar22].m_backend;
      if (!tVar19) {
        pcVar21 = &local_918;
      }
      uVar9 = *(undefined8 *)(pcVar21->data)._M_elems;
      uVar10 = *(undefined8 *)((pcVar21->data)._M_elems + 2);
      uVar11 = *(undefined8 *)((pcVar21->data)._M_elems + 4);
      uVar12 = *(undefined8 *)((pcVar21->data)._M_elems + 6);
      uVar13 = *(undefined8 *)((pcVar21->data)._M_elems + 8);
      uVar14 = *(undefined8 *)((pcVar21->data)._M_elems + 10);
      uVar15 = *(undefined8 *)((pcVar21->data)._M_elems + 0xc);
      _uStack_a30 = *(undefined8 *)((pcVar21->data)._M_elems + 0xe);
      local_a38 = (uint)uVar15;
      uStack_a34 = (uint)((ulong)uVar15 >> 0x20);
      local_a48 = (uint)uVar13;
      uStack_a44 = (uint)((ulong)uVar13 >> 0x20);
      uStack_a40 = (uint)uVar14;
      uStack_a3c = (uint)((ulong)uVar14 >> 0x20);
      local_a58 = (uint)uVar11;
      uStack_a54 = (uint)((ulong)uVar11 >> 0x20);
      uStack_a50 = (uint)uVar12;
      uStack_a4c = (uint)((ulong)uVar12 >> 0x20);
      local_a68._0_4_ = (undefined4)uVar9;
      local_a68._4_4_ = (undefined4)((ulong)uVar9 >> 0x20);
      local_a68._8_4_ = (undefined4)uVar10;
      uStack_a5c = (uint)((ulong)uVar10 >> 0x20);
      local_a28 = pcVar21->exp;
      local_a24 = pcVar21->neg;
      local_a20 = pcVar21->fpclass;
      iStack_a1c = pcVar21->prec_elem;
    }
    if (bVar17) {
      local_5d8.m_backend.data._M_elems[1] = local_a18.data._M_elems[1];
      local_5d8.m_backend.data._M_elems[0] = local_a18.data._M_elems[0];
      local_5d8.m_backend.data._M_elems[3] = local_a18.data._M_elems[3];
      local_5d8.m_backend.data._M_elems[2] = local_a18.data._M_elems[2];
      local_5d8.m_backend.data._M_elems[5] = local_a18.data._M_elems[5];
      local_5d8.m_backend.data._M_elems[4] = local_a18.data._M_elems[4];
      local_5d8.m_backend.data._M_elems[7] = local_a18.data._M_elems[7];
      local_5d8.m_backend.data._M_elems[6] = local_a18.data._M_elems[6];
      local_5d8.m_backend.data._M_elems[9] = local_a18.data._M_elems[9];
      local_5d8.m_backend.data._M_elems[8] = local_a18.data._M_elems[8];
      local_5d8.m_backend.data._M_elems[0xb] = local_a18.data._M_elems[0xb];
      local_5d8.m_backend.data._M_elems[10] = local_a18.data._M_elems[10];
      local_5d8.m_backend.data._M_elems[0xd] = local_a18.data._M_elems[0xd];
      local_5d8.m_backend.data._M_elems[0xc] = local_a18.data._M_elems[0xc];
      local_5d8.m_backend.data._M_elems[0xf] = local_a18.data._M_elems[0xf];
      local_5d8.m_backend.data._M_elems[0xe] = local_a18.data._M_elems[0xe];
      local_5d8.m_backend.exp = local_a18.exp;
      local_5d8.m_backend.neg = local_a18.neg;
      local_5d8.m_backend.fpclass = local_a18.fpclass;
      local_5d8.m_backend.prec_elem = local_a18.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                (&local_2b0,0.0,(type *)0x0);
      feastol(&local_300,this);
      bVar18 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                         (&local_5d8,
                          (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&local_2b0,&local_300);
      if (bVar18) {
        local_628.m_backend.data._M_elems[1] = local_a68._4_4_;
        local_628.m_backend.data._M_elems[0] = local_a68._0_4_;
        local_628.m_backend.data._M_elems[3] = uStack_a5c;
        local_628.m_backend.data._M_elems[2] = local_a68._8_4_;
        local_628.m_backend.data._M_elems[5] = uStack_a54;
        local_628.m_backend.data._M_elems[4] = local_a58;
        local_628.m_backend.data._M_elems[7] = uStack_a4c;
        local_628.m_backend.data._M_elems[6] = uStack_a50;
        local_628.m_backend.data._M_elems[9] = uStack_a44;
        local_628.m_backend.data._M_elems[8] = local_a48;
        local_628.m_backend.data._M_elems[0xb] = uStack_a3c;
        local_628.m_backend.data._M_elems[10] = uStack_a40;
        local_628.m_backend.data._M_elems[0xd] = uStack_a34;
        local_628.m_backend.data._M_elems[0xc] = local_a38;
        local_628.m_backend.data._M_elems[0xe] = uStack_a30;
        local_628.m_backend.data._M_elems[0xf] = uStack_a2c;
        local_628.m_backend.exp = local_a28;
        local_628.m_backend.neg = local_a24;
        local_628.m_backend.fpclass = local_a20;
        local_628.m_backend.prec_elem = iStack_a1c;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                  (&local_350,0.0,(type *)0x0);
        feastol(&local_3a0,this);
        bVar18 = GE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                           (&local_628,
                            (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_350,&local_3a0);
        if (bVar18) {
          boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                    ((cpp_dec_float<100u,int,void> *)
                     (local_740._M_impl.super__Vector_impl_data._M_start + uVar22),0.0);
          goto LAB_003382a3;
        }
      }
      bVar17 = false;
    }
LAB_003382a3:
    puVar3 = local_8a0._M_impl.super__Vector_impl_data._M_start[uVar22].m_backend.data._M_elems +
             0xc;
    *(ulong *)puVar3 = CONCAT44(local_a18.data._M_elems[0xd],local_a18.data._M_elems[0xc]);
    *(ulong *)(puVar3 + 2) = CONCAT44(local_a18.data._M_elems[0xf],local_a18.data._M_elems[0xe]);
    puVar3 = local_8a0._M_impl.super__Vector_impl_data._M_start[uVar22].m_backend.data._M_elems + 8;
    *(ulong *)puVar3 = CONCAT44(local_a18.data._M_elems[9],local_a18.data._M_elems[8]);
    *(ulong *)(puVar3 + 2) = CONCAT44(local_a18.data._M_elems[0xb],local_a18.data._M_elems[10]);
    puVar3 = local_8a0._M_impl.super__Vector_impl_data._M_start[uVar22].m_backend.data._M_elems + 4;
    *(ulong *)puVar3 = CONCAT44(local_a18.data._M_elems[5],local_a18.data._M_elems[4]);
    *(ulong *)(puVar3 + 2) = CONCAT44(local_a18.data._M_elems[7],local_a18.data._M_elems[6]);
    *(ulong *)local_8a0._M_impl.super__Vector_impl_data._M_start[uVar22].m_backend.data._M_elems =
         CONCAT44(local_a18.data._M_elems[1],local_a18.data._M_elems[0]);
    *(ulong *)(local_8a0._M_impl.super__Vector_impl_data._M_start[uVar22].m_backend.data._M_elems +
              2) = CONCAT44(local_a18.data._M_elems[3],local_a18.data._M_elems[2]);
    local_8a0._M_impl.super__Vector_impl_data._M_start[uVar22].m_backend.exp = local_a18.exp;
    local_8a0._M_impl.super__Vector_impl_data._M_start[uVar22].m_backend.neg = local_a18.neg;
    local_8a0._M_impl.super__Vector_impl_data._M_start[uVar22].m_backend.fpclass = local_a18.fpclass
    ;
    local_8a0._M_impl.super__Vector_impl_data._M_start[uVar22].m_backend.prec_elem =
         local_a18.prec_elem;
    puVar3 = local_8b8._M_impl.super__Vector_impl_data._M_start[uVar22].m_backend.data._M_elems +
             0xc;
    *(ulong *)puVar3 = CONCAT44(uStack_a34,local_a38);
    *(undefined8 *)(puVar3 + 2) = _uStack_a30;
    puVar3 = local_8b8._M_impl.super__Vector_impl_data._M_start[uVar22].m_backend.data._M_elems + 8;
    *(ulong *)puVar3 = CONCAT44(uStack_a44,local_a48);
    *(ulong *)(puVar3 + 2) = CONCAT44(uStack_a3c,uStack_a40);
    puVar3 = local_8b8._M_impl.super__Vector_impl_data._M_start[uVar22].m_backend.data._M_elems + 4;
    *(ulong *)puVar3 = CONCAT44(uStack_a54,local_a58);
    *(ulong *)(puVar3 + 2) = CONCAT44(uStack_a4c,uStack_a50);
    *(ulong *)local_8b8._M_impl.super__Vector_impl_data._M_start[uVar22].m_backend.data._M_elems =
         CONCAT44(local_a68._4_4_,local_a68._0_4_);
    *(ulong *)(local_8b8._M_impl.super__Vector_impl_data._M_start[uVar22].m_backend.data._M_elems +
              2) = CONCAT44(uStack_a5c,local_a68._8_4_);
    local_8b8._M_impl.super__Vector_impl_data._M_start[uVar22].m_backend.exp = local_a28;
    local_8b8._M_impl.super__Vector_impl_data._M_start[uVar22].m_backend.neg = local_a24;
    local_8b8._M_impl.super__Vector_impl_data._M_start[uVar22].m_backend.fpclass = local_a20;
    local_8b8._M_impl.super__Vector_impl_data._M_start[uVar22].m_backend.prec_elem = iStack_a1c;
    tVar19 = boost::multiprecision::operator>
                       (local_960._M_impl.super__Vector_impl_data._M_start + uVar22,
                        local_948._M_impl.super__Vector_impl_data._M_start + uVar22);
    if (tVar19) {
      puVar3 = local_930._M_impl.super__Vector_impl_data._M_start[uVar22].m_backend.data._M_elems +
               0xc;
      *(ulong *)puVar3 = CONCAT44(uStack_a34,local_a38);
      *(undefined8 *)(puVar3 + 2) = _uStack_a30;
      puVar3 = local_930._M_impl.super__Vector_impl_data._M_start[uVar22].m_backend.data._M_elems +
               8;
      *(ulong *)puVar3 = CONCAT44(uStack_a44,local_a48);
      *(ulong *)(puVar3 + 2) = CONCAT44(uStack_a3c,uStack_a40);
      puVar3 = local_930._M_impl.super__Vector_impl_data._M_start[uVar22].m_backend.data._M_elems +
               4;
      *(ulong *)puVar3 = CONCAT44(uStack_a54,local_a58);
      *(ulong *)(puVar3 + 2) = CONCAT44(uStack_a4c,uStack_a50);
      *(ulong *)local_930._M_impl.super__Vector_impl_data._M_start[uVar22].m_backend.data._M_elems =
           CONCAT44(local_a68._4_4_,local_a68._0_4_);
      *(ulong *)(local_930._M_impl.super__Vector_impl_data._M_start[uVar22].m_backend.data._M_elems
                + 2) = CONCAT44(uStack_a5c,local_a68._8_4_);
      local_930._M_impl.super__Vector_impl_data._M_start[uVar22].m_backend.exp = local_a28;
      local_930._M_impl.super__Vector_impl_data._M_start[uVar22].m_backend.neg = local_a24;
      local_970 = _local_a20;
    }
    else {
      tVar19 = boost::multiprecision::operator<
                         (local_960._M_impl.super__Vector_impl_data._M_start + uVar22,
                          local_948._M_impl.super__Vector_impl_data._M_start + uVar22);
      if (tVar19) {
        puVar3 = local_930._M_impl.super__Vector_impl_data._M_start[uVar22].m_backend.data._M_elems
                 + 0xc;
        *(ulong *)puVar3 = CONCAT44(local_a18.data._M_elems[0xd],local_a18.data._M_elems[0xc]);
        *(ulong *)(puVar3 + 2) = CONCAT44(local_a18.data._M_elems[0xf],local_a18.data._M_elems[0xe])
        ;
        puVar3 = local_930._M_impl.super__Vector_impl_data._M_start[uVar22].m_backend.data._M_elems
                 + 8;
        *(ulong *)puVar3 = CONCAT44(local_a18.data._M_elems[9],local_a18.data._M_elems[8]);
        *(ulong *)(puVar3 + 2) = CONCAT44(local_a18.data._M_elems[0xb],local_a18.data._M_elems[10]);
        puVar3 = local_930._M_impl.super__Vector_impl_data._M_start[uVar22].m_backend.data._M_elems
                 + 4;
        *(ulong *)puVar3 = CONCAT44(local_a18.data._M_elems[5],local_a18.data._M_elems[4]);
        *(ulong *)(puVar3 + 2) = CONCAT44(local_a18.data._M_elems[7],local_a18.data._M_elems[6]);
        *(ulong *)local_930._M_impl.super__Vector_impl_data._M_start[uVar22].m_backend.data._M_elems
             = CONCAT44(local_a18.data._M_elems[1],local_a18.data._M_elems[0]);
        *(ulong *)(local_930._M_impl.super__Vector_impl_data._M_start[uVar22].m_backend.data.
                   _M_elems + 2) = CONCAT44(local_a18.data._M_elems[3],local_a18.data._M_elems[2]);
        local_930._M_impl.super__Vector_impl_data._M_start[uVar22].m_backend.exp = local_a18.exp;
        local_930._M_impl.super__Vector_impl_data._M_start[uVar22].m_backend.neg = local_a18.neg;
        local_970 = local_a18._72_8_;
      }
      else {
        local_888.fpclass = cpp_dec_float_finite;
        local_888.prec_elem = 0x10;
        local_888.data._M_elems[0] = 0;
        local_888.data._M_elems[1] = 0;
        local_888.data._M_elems[2] = 0;
        local_888.data._M_elems[3] = 0;
        local_888.data._M_elems[4] = 0;
        local_888.data._M_elems[5] = 0;
        local_888.data._M_elems[6] = 0;
        local_888.data._M_elems[7] = 0;
        local_888.data._M_elems[8] = 0;
        local_888.data._M_elems[9] = 0;
        local_888.data._M_elems[10] = 0;
        local_888.data._M_elems[0xb] = 0;
        local_888.data._M_elems[0xc] = 0;
        local_888.data._M_elems[0xd] = 0;
        local_888.data._M_elems[0xe] = 0;
        local_888.data._M_elems[0xf] = 0;
        local_888.exp = 0;
        local_888.neg = false;
        boost::multiprecision::default_ops::
        eval_add_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  (&local_888,&local_a18,(cpp_dec_float<100U,_int,_void> *)local_a68);
        local_8c0 = 2.0;
        local_970._0_4_ = cpp_dec_float_finite;
        local_970._4_4_ = 0x10;
        local_9b8 = (undefined1  [8])0x0;
        _Stack_9b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_9a8[0] = 0;
        local_9a8[1] = 0;
        local_9a8[2] = 0;
        local_9a8[3] = 0;
        local_9a8[4] = 0;
        local_9a8[5] = 0;
        local_9a8[6] = 0;
        local_9a8[7] = 0;
        local_9a8[8] = 0;
        local_9a8[9] = 0;
        stack0xfffffffffffff680 = 0;
        uStack_97b = 0;
        iStack_978 = 0;
        bStack_974 = false;
        boost::multiprecision::default_ops::
        eval_divide_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,double>
                  ((cpp_dec_float<100U,_int,_void> *)local_9b8,&local_888,&local_8c0);
        puVar3 = local_930._M_impl.super__Vector_impl_data._M_start[uVar22].m_backend.data._M_elems
                 + 0xc;
        *(undefined8 *)puVar3 = local_9a8._32_8_;
        *(ulong *)(puVar3 + 2) = CONCAT35(uStack_97b,stack0xfffffffffffff680);
        puVar3 = local_930._M_impl.super__Vector_impl_data._M_start[uVar22].m_backend.data._M_elems
                 + 8;
        *(undefined8 *)puVar3 = local_9a8._16_8_;
        *(undefined8 *)(puVar3 + 2) = local_9a8._24_8_;
        puVar3 = local_930._M_impl.super__Vector_impl_data._M_start[uVar22].m_backend.data._M_elems
                 + 4;
        *(undefined8 *)puVar3 = local_9a8._0_8_;
        *(undefined8 *)(puVar3 + 2) = local_9a8._8_8_;
        *(undefined1 (*) [8])
         local_930._M_impl.super__Vector_impl_data._M_start[uVar22].m_backend.data._M_elems =
             local_9b8;
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
         (local_930._M_impl.super__Vector_impl_data._M_start[uVar22].m_backend.data._M_elems + 2) =
             _Stack_9b0._M_pi;
        local_930._M_impl.super__Vector_impl_data._M_start[uVar22].m_backend.exp = iStack_978;
        local_930._M_impl.super__Vector_impl_data._M_start[uVar22].m_backend.neg = bStack_974;
      }
    }
    local_930._M_impl.super__Vector_impl_data._M_start[uVar22].m_backend.fpclass =
         (fpclass_type)local_970;
    local_930._M_impl.super__Vector_impl_data._M_start[uVar22].m_backend.prec_elem =
         SUB84(local_970,4);
    local_970._0_4_ = cpp_dec_float_finite;
    local_970._4_4_ = 0x10;
    local_9b8 = (undefined1  [8])0x0;
    _Stack_9b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_9a8[0] = 0;
    local_9a8[1] = 0;
    local_9a8[2] = 0;
    local_9a8[3] = 0;
    local_9a8[4] = 0;
    local_9a8[5] = 0;
    local_9a8[6] = 0;
    local_9a8[7] = 0;
    local_9a8[8] = 0;
    local_9a8[9] = 0;
    stack0xfffffffffffff680 = 0;
    uStack_97b = 0;
    iStack_978 = 0;
    bStack_974 = false;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              ((cpp_dec_float<100U,_int,_void> *)local_9b8,
               &(lp->
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).object.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar22].m_backend,
               &local_8a0._M_impl.super__Vector_impl_data._M_start[uVar22].m_backend);
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
              (&local_798,(cpp_dec_float<100U,_int,_void> *)local_9b8);
    local_970._0_4_ = cpp_dec_float_finite;
    local_970._4_4_ = 0x10;
    local_9b8 = (undefined1  [8])0x0;
    _Stack_9b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_9a8[0] = 0;
    local_9a8[1] = 0;
    local_9a8[2] = 0;
    local_9a8[3] = 0;
    local_9a8[4] = 0;
    local_9a8[5] = 0;
    local_9a8[6] = 0;
    local_9a8[7] = 0;
    local_9a8[8] = 0;
    local_9a8[9] = 0;
    stack0xfffffffffffff680 = 0;
    uStack_97b = 0;
    iStack_978 = 0;
    bStack_974 = false;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              ((cpp_dec_float<100U,_int,_void> *)local_9b8,
               &(lp->
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).object.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar22].m_backend,
               &local_8b8._M_impl.super__Vector_impl_data._M_start[uVar22].m_backend);
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
              (&local_7e8,(cpp_dec_float<100U,_int,_void> *)local_9b8);
    local_970._0_4_ = cpp_dec_float_finite;
    local_970._4_4_ = 0x10;
    local_9b8 = (undefined1  [8])0x0;
    _Stack_9b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_9a8[0] = 0;
    local_9a8[1] = 0;
    local_9a8[2] = 0;
    local_9a8[3] = 0;
    local_9a8[4] = 0;
    local_9a8[5] = 0;
    local_9a8[6] = 0;
    local_9a8[7] = 0;
    local_9a8[8] = 0;
    local_9a8[9] = 0;
    stack0xfffffffffffff680 = 0;
    uStack_97b = 0;
    iStack_978 = 0;
    bStack_974 = false;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              ((cpp_dec_float<100U,_int,_void> *)local_9b8,
               &(lp->
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).object.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar22].m_backend,
               &local_930._M_impl.super__Vector_impl_data._M_start[uVar22].m_backend);
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
              (&local_838,(cpp_dec_float<100U,_int,_void> *)local_9b8);
    uVar22 = local_8c8;
  } while( true );
}

Assistant:

void SPxMainSM<R>::trivialHeuristic(SPxLPBase<R>& lp)
{
   VectorBase<R>         zerosol(lp.nCols());  // the zero solution VectorBase<R>
   VectorBase<R>         lowersol(lp.nCols()); // the lower bound solution VectorBase<R>
   VectorBase<R>         uppersol(lp.nCols()); // the upper bound solution VectorBase<R>
   VectorBase<R>         locksol(lp.nCols());  // the locks solution VectorBase<R>

   VectorBase<R>         upLocks(lp.nCols());
   VectorBase<R>         downLocks(lp.nCols());

   R            zeroObj = this->m_objoffset;
   R            lowerObj = this->m_objoffset;
   R            upperObj = this->m_objoffset;
   R            lockObj = this->m_objoffset;

   bool            zerovalid = true;

   R largeValue = R(infinity);

   if(LT(R(1.0 / feastol()), R(infinity), this->tolerances()->epsilon()))
      largeValue = 1.0 / feastol();



   for(int j = lp.nCols() - 1; j >= 0; --j)
   {
      upLocks[j] = 0;
      downLocks[j] = 0;

      // computing the locks on the variables
      const SVectorBase<R>& col = lp.colVector(j);

      for(int k = 0; k < col.size(); ++k)
      {
         R aij = col.value(k);

         SOPLEX_ASSERT_WARN("WMAISM45", isNotZero(aij, R(1.0 / R(infinity))));

         if(GT(lp.lhs(col.index(k)), R(-infinity), this->tolerances()->epsilon())
               && LT(lp.rhs(col.index(k)), R(infinity), this->tolerances()->epsilon()))
         {
            upLocks[j]++;
            downLocks[j]++;
         }
         else if(GT(lp.lhs(col.index(k)), R(-infinity), this->tolerances()->epsilon()))
         {
            if(aij > 0)
               downLocks[j]++;
            else if(aij < 0)
               upLocks[j]++;
         }
         else if(LT(lp.rhs(col.index(k)), R(infinity), this->tolerances()->epsilon()))
         {
            if(aij > 0)
               upLocks[j]++;
            else if(aij < 0)
               downLocks[j]++;
         }
      }

      R lower = lp.lower(j);
      R upper = lp.upper(j);

      if(LE(lower, R(-infinity), this->tolerances()->epsilon()))
         lower = SOPLEX_MIN(-largeValue, upper);

      if(GE(upper, R(infinity), this->tolerances()->epsilon()))
         upper = SOPLEX_MAX(lp.lower(j), largeValue);

      if(zerovalid)
      {
         if(LE(lower, R(0.0), feastol()) && GE(upper, R(0.0), feastol()))
            zerosol[j] = 0.0;
         else
            zerovalid = false;
      }

      lowersol[j] = lower;
      uppersol[j] = upper;

      if(downLocks[j] > upLocks[j])
         locksol[j] = upper;
      else if(downLocks[j] < upLocks[j])
         locksol[j] = lower;
      else
         locksol[j] = (lower + upper) / 2.0;

      lowerObj += lp.maxObj(j) * lowersol[j];
      upperObj += lp.maxObj(j) * uppersol[j];
      lockObj += lp.maxObj(j) * locksol[j];
   }

   // trying the lower bound solution
   if(checkSolution(lp, lowersol))
   {
      if(lowerObj > m_cutoffbound)
         m_cutoffbound = lowerObj;
   }

   // trying the upper bound solution
   if(checkSolution(lp, uppersol))
   {
      if(upperObj > m_cutoffbound)
         m_cutoffbound = upperObj;
   }

   // trying the zero solution
   if(zerovalid && checkSolution(lp, zerosol))
   {
      if(zeroObj > m_cutoffbound)
         m_cutoffbound = zeroObj;
   }

   // trying the lock solution
   if(checkSolution(lp, locksol))
   {
      if(lockObj > m_cutoffbound)
         m_cutoffbound = lockObj;
   }
}